

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O0

AuxArray<double> *
Js::ByteCodeReader::ReadAuxArrayWithLock<double>(uint offset,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ByteBlock *pBVar4;
  byte *pbVar5;
  size_t sVar6;
  undefined4 *puVar7;
  AuxArray<double> *auxArray;
  FunctionBody *functionBody_local;
  uint offset_local;
  
  pBVar4 = FunctionBody::GetAuxiliaryDataWithLock(functionBody);
  pbVar5 = ByteBlock::GetBuffer(pBVar4);
  sVar6 = AuxArray<double>::GetDataSize((AuxArray<double> *)(pbVar5 + offset));
  pBVar4 = FunctionBody::GetAuxiliaryDataWithLock(functionBody);
  uVar3 = ByteBlock::GetLength(pBVar4);
  if ((ulong)uVar3 < offset + sVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0xf0,
                                "(offset + auxArray->GetDataSize() <= functionBody->GetAuxiliaryDataWithLock()->GetLength())"
                                ,
                                "offset + auxArray->GetDataSize() <= functionBody->GetAuxiliaryDataWithLock()->GetLength()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return (AuxArray<double> *)(pbVar5 + offset);
}

Assistant:

AuxArray<T> const * ByteCodeReader::ReadAuxArrayWithLock(uint offset, FunctionBody * functionBody)
    {
        Js::AuxArray<T> const * auxArray = (Js::AuxArray<T> const *)(functionBody->GetAuxiliaryDataWithLock()->GetBuffer() + offset);
        Assert(offset + auxArray->GetDataSize() <= functionBody->GetAuxiliaryDataWithLock()->GetLength());
        return auxArray;
    }